

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__compute_transparency16(stbi__png *z,stbi__uint16 *tc,int out_n)

{
  int in_EAX;
  short *in_RCX;
  undefined4 in_register_00000014;
  long lVar1;
  long lVar2;
  int iVar3;
  int in_R8D;
  
  lVar1 = CONCAT44(in_register_00000014,out_n);
  iVar3 = (int)z * (int)tc;
  if (in_R8D == 2) {
    if (iVar3 != 0) {
      lVar2 = 0;
      do {
        *(ushort *)(lVar1 + 2 + lVar2 * 4) = -(ushort)(*(short *)(lVar1 + lVar2 * 4) != *in_RCX);
        lVar2 = lVar2 + 1;
        in_EAX = iVar3;
      } while (iVar3 != (int)lVar2);
    }
  }
  else {
    if (in_R8D != 4) {
      __assert_fail("out_n == 2 || out_n == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/florentdup[P]projet-info-trou-noir/version_cpp_kerr/stb_image.h"
                    ,0x129f,"int stbi__compute_transparency16(stbi__png *, stbi__uint16 *, int)");
    }
    if (iVar3 != 0) {
      lVar2 = 0;
      do {
        if (((*(short *)(lVar1 + lVar2 * 8) == *in_RCX) &&
            (*(short *)(lVar1 + 2 + lVar2 * 8) == in_RCX[1])) &&
           (*(short *)(lVar1 + 4 + lVar2 * 8) == in_RCX[2])) {
          *(undefined2 *)(lVar1 + 6 + lVar2 * 8) = 0;
        }
        lVar2 = lVar2 + 1;
        in_EAX = iVar3;
      } while (iVar3 != (int)lVar2);
    }
  }
  return in_EAX;
}

Assistant:

static int stbi__compute_transparency16(stbi__png *z, stbi__uint16 tc[3], int out_n)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi__uint16 *p = (stbi__uint16*) z->out;

   // compute color-based transparency, assuming we've
   // already got 65535 as the alpha value in the output
   STBI_ASSERT(out_n == 2 || out_n == 4);

   if (out_n == 2) {
      for (i = 0; i < pixel_count; ++i) {
         p[1] = (p[0] == tc[0] ? 0 : 65535);
         p += 2;
      }
   } else {
      for (i = 0; i < pixel_count; ++i) {
         if (p[0] == tc[0] && p[1] == tc[1] && p[2] == tc[2])
            p[3] = 0;
         p += 4;
      }
   }
   return 1;
}